

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O1

void nni_tcp_dialer_close(nni_tcp_dialer *d)

{
  nni_aio *aio;
  nng_stream *s;
  
  nni_mtx_lock(&d->mtx);
  if (d->closed == false) {
    d->closed = true;
    aio = (nni_aio *)nni_list_first(&d->connq);
    while (aio != (nni_aio *)0x0) {
      nni_list_remove(&d->connq,aio);
      s = (nng_stream *)nni_aio_get_prov_data(aio);
      if (s != (nng_stream *)0x0) {
        s[3].s_get = (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0;
        nni_aio_set_prov_data(aio,(void *)0x0);
        nng_stream_close(s);
        nng_stream_free(s);
      }
      nni_aio_finish_error(aio,NNG_ECLOSED);
      aio = (nni_aio *)nni_list_first(&d->connq);
    }
  }
  nni_mtx_unlock(&d->mtx);
  return;
}

Assistant:

void
nni_tcp_dialer_close(nni_tcp_dialer *d)
{
	nni_mtx_lock(&d->mtx);
	if (!d->closed) {
		nni_aio *aio;
		d->closed = true;
		while ((aio = nni_list_first(&d->connq)) != NULL) {
			nni_tcp_conn *c;
			nni_list_remove(&d->connq, aio);
			if ((c = nni_aio_get_prov_data(aio)) != NULL) {
				c->dial_aio = NULL;
				nni_aio_set_prov_data(aio, NULL);
				nng_stream_close(&c->stream);
				nng_stream_free(&c->stream);
			}
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
	}
	nni_mtx_unlock(&d->mtx);
}